

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall
fmt::v8::detail::format_dragon
          (detail *this,fp value,bool is_predecessor_closer,int num_digits,buffer<char> *buf,
          int *exp10)

{
  undefined8 *puVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  uint uVar8;
  bigint *this_00;
  bigint *lhs2;
  long lVar9;
  undefined4 in_register_00000084;
  uint64_t value_00;
  ulong uVar10;
  int iVar11;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  uVar10 = CONCAT71(in_register_00000009,is_predecessor_closer);
  puVar1 = (undefined8 *)CONCAT44(in_register_00000084,num_digits);
  uVar7 = uVar10 & 0xffffffff;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123ca8;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123ca8;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123ca8;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  this_00 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123ca8;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  iVar11 = value.e + 1;
  value_00 = (long)this << ((byte)iVar11 & 0x3f);
  iVar3 = (int)value.f;
  cVar2 = (char)value.e;
  if (iVar3 < 0) {
    if (*(int *)&buf->_vptr_buffer < 0) {
      bigint::assign_pow10(&local_240,-*(int *)&buf->_vptr_buffer);
      bigint::assign(&local_190,&local_240);
      if (cVar2 == '\0') {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &local_e0;
        bigint::assign(this_00,&local_240);
        bigint::operator<<=(this_00,1);
      }
      bigint::operator*=(&local_240,value_00);
      bigint::assign(&local_2f0,1);
      bigint::operator<<=(&local_2f0,iVar11 - iVar3);
    }
    else {
      bigint::assign(&local_240,value_00);
      bigint::assign_pow10(&local_2f0,*(int *)&buf->_vptr_buffer);
      bigint::operator<<=(&local_2f0,iVar11 - iVar3);
      bigint::assign(&local_190,1);
      if (cVar2 == '\0') {
        this_00 = (bigint *)0x0;
      }
      else {
        bigint::assign(this_00,2);
      }
    }
  }
  else {
    bigint::assign(&local_240,value_00);
    bigint::operator<<=(&local_240,iVar3);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar3);
    if (cVar2 == '\0') {
      this_00 = (bigint *)0x0;
    }
    else {
      this_00 = &local_e0;
      bigint::assign(this_00,1);
      bigint::operator<<=(this_00,iVar3 + 1);
    }
    bigint::assign_pow10(&local_2f0,*(int *)&buf->_vptr_buffer);
    bigint::operator<<=(&local_2f0,iVar11);
  }
  iVar3 = (int)uVar10;
  if (-1 < iVar3) {
    *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (iVar3 + -1);
    uVar8 = iVar3 - 1;
    if (iVar3 == 0) {
      bigint::multiply(&local_2f0,10);
      iVar3 = add_compare(&local_240,&local_240,&local_2f0);
      lVar5 = puVar1[2];
      uVar10 = lVar5 + 1;
      if ((ulong)puVar1[3] < uVar10) {
        (**(code **)*puVar1)(puVar1);
        lVar5 = puVar1[2];
        uVar10 = lVar5 + 1;
      }
      puVar1[2] = uVar10;
      *(byte *)(puVar1[1] + lVar5) = 0 < iVar3 | 0x30;
    }
    else {
      uVar10 = uVar10 & 0xffffffff;
      uVar6 = puVar1[3];
      if (uVar6 < uVar10) {
        (**(code **)*puVar1)(puVar1,uVar10);
        uVar6 = puVar1[3];
      }
      if (uVar6 < uVar10) {
        uVar10 = uVar6;
      }
      puVar1[2] = uVar10;
      if (iVar3 != 1) {
        uVar10 = 0;
        do {
          iVar11 = bigint::divmod_assign(&local_240,&local_2f0);
          *(char *)(puVar1[1] + uVar10) = (char)iVar11 + '0';
          bigint::multiply(&local_240,10);
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      uVar4 = bigint::divmod_assign(&local_240,&local_2f0);
      iVar11 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar11) || ((uVar4 & 1) != 0 && iVar11 == 0)) {
        if (uVar4 == 9) {
          *(undefined1 *)(puVar1[1] + (long)(int)uVar8) = 0x3a;
          if (iVar3 != 1) {
            uVar10 = (ulong)(iVar3 - 2);
            do {
              uVar8 = (int)uVar7 - 1;
              uVar7 = (ulong)uVar8;
              if (*(char *)(puVar1[1] + uVar7) != ':') break;
              *(undefined1 *)(puVar1[1] + uVar7) = 0x30;
              *(char *)(puVar1[1] + uVar10) = *(char *)(puVar1[1] + uVar10) + '\x01';
              uVar10 = uVar10 - 1;
            } while (1 < (int)uVar8);
          }
          if (*(char *)puVar1[1] == ':') {
            *(char *)puVar1[1] = '1';
            *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer + 1;
          }
          goto LAB_001115af;
        }
        uVar4 = uVar4 + 1;
      }
      *(char *)(puVar1[1] + (long)(int)uVar8) = (char)uVar4 + '0';
    }
    goto LAB_001115af;
  }
  lhs2 = this_00;
  if (this_00 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  lVar5 = puVar1[1];
  uVar8 = ~(uint)this & 1;
  lVar9 = 0;
  while( true ) {
    uVar4 = bigint::divmod_assign(&local_240,&local_2f0);
    iVar3 = compare(&local_240,&local_190);
    iVar11 = add_compare(&local_240,lhs2,&local_2f0);
    *(char *)(lVar5 + lVar9) = (char)uVar4 + '0';
    if ((iVar3 < (int)uVar8) || ((int)-uVar8 < iVar11)) break;
    bigint::multiply(&local_240,10);
    bigint::multiply(&local_190,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(this_00,10);
    }
    lVar9 = lVar9 + 1;
  }
  if (iVar3 < (int)uVar8) {
    if ((int)-uVar8 < iVar11) {
      iVar3 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar3) || ((uVar4 & 1) != 0 && iVar3 == 0)) {
        cVar2 = *(char *)(lVar5 + lVar9) + '\x01';
        goto LAB_00111508;
      }
    }
  }
  else {
    cVar2 = (char)uVar4 + '1';
LAB_00111508:
    *(char *)(lVar5 + lVar9) = cVar2;
  }
  uVar7 = lVar9 + 1U & 0xffffffff;
  uVar10 = puVar1[3];
  if (uVar10 < uVar7) {
    (**(code **)*puVar1)(puVar1,uVar7);
    uVar10 = puVar1[3];
  }
  if (uVar10 < uVar7) {
    uVar7 = uVar10;
  }
  puVar1[2] = uVar7;
  *(int *)&buf->_vptr_buffer = *(int *)&buf->_vptr_buffer - (int)lVar9;
LAB_001115af:
  bigint::~bigint(&local_e0);
  bigint::~bigint(&local_190);
  bigint::~bigint(&local_2f0);
  bigint::~bigint(&local_240);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(fp value, bool is_predecessor_closer,
                                          int num_digits, buffer<char>& buf,
                                          int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}